

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btTypedConstraint.cpp
# Opt level: O0

void __thiscall
btTypedConstraint::btTypedConstraint
          (btTypedConstraint *this,btTypedConstraintType type,btRigidBody *rbA,btRigidBody *rbB)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  
  btTypedObject::btTypedObject((btTypedObject *)(in_RDI + 1),in_ESI);
  *in_RDI = &PTR__btTypedConstraint_002e0850;
  *(undefined4 *)((long)in_RDI + 0xc) = 0xffffffff;
  in_RDI[2] = 0xffffffffffffffff;
  *(undefined4 *)(in_RDI + 3) = 0x7f7fffff;
  *(undefined1 *)((long)in_RDI + 0x1c) = 1;
  *(undefined1 *)((long)in_RDI + 0x1d) = 0;
  *(undefined4 *)(in_RDI + 4) = 0xffffffff;
  in_RDI[5] = in_RDX;
  in_RDI[6] = in_RCX;
  *(undefined4 *)(in_RDI + 7) = 0;
  *(undefined4 *)((long)in_RDI + 0x3c) = 0x3e99999a;
  in_RDI[8] = 0;
  return;
}

Assistant:

btTypedConstraint::btTypedConstraint(btTypedConstraintType type, btRigidBody& rbA,btRigidBody& rbB)
:btTypedObject(type),
m_userConstraintType(-1),
m_userConstraintPtr((void*)-1),
m_breakingImpulseThreshold(SIMD_INFINITY),
m_isEnabled(true),
m_needsFeedback(false),
m_overrideNumSolverIterations(-1),
m_rbA(rbA),
m_rbB(rbB),
m_appliedImpulse(btScalar(0.)),
m_dbgDrawSize(DEFAULT_DEBUGDRAW_SIZE),
m_jointFeedback(0)
{
}